

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O3

void __thiscall TCLAP::CmdLine::reset(CmdLine *this)

{
  _List_node_base *p_Var1;
  
  for (p_Var1 = (this->_argList).super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->_argList; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x68))();
  }
  (this->_progName)._M_string_length = 0;
  *(this->_progName)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

inline void CmdLine::reset()
{
	for( ArgListIterator it = _argList.begin(); it != _argList.end(); it++ )
		(*it)->reset();
	
	_progName.clear();
}